

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isNotInType(TokenKind kind)

{
  TokenKind in_DI;
  bool local_1;
  
  if ((in_DI == EndOfFile) || (in_DI == Semicolon)) {
    local_1 = true;
  }
  else {
    local_1 = isEndKeyword(in_DI);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isNotInType(TokenKind kind) {
    switch (kind) {
        case TokenKind::Semicolon:
        case TokenKind::EndOfFile:
            return true;
        default:
            return isEndKeyword(kind);
    }
}